

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O1

void __thiscall
OmegaOP::algoSMOOTHING(OmegaOP *this,vector<double,_std::allocator<double>_> *data,double minAngle)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  OmegaOP *pOVar4;
  ulong uVar5;
  bool bVar6;
  double **ppdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  Costs cost;
  uint local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  OmegaOP *local_60;
  double *local_58;
  double local_50;
  long local_48;
  ulong local_40;
  double minAngle_local;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_78 = (ulong)this->nbStates;
  minAngle_local = minAngle;
  Costs::Costs(&cost);
  ppdVar7 = preprocessing(this,data);
  this->S12P = ppdVar7;
  uVar11 = (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1;
  local_68 = (ulong)uVar11;
  local_8c = 2;
  if (2 < uVar11) {
    local_48 = local_78 * 8;
    local_60 = this;
    do {
      if (local_78 != 0) {
        local_40 = 0;
        do {
          local_88 = 1;
          local_84 = 0;
          local_80 = INFINITY;
          local_70 = 0;
          if (1 < local_8c) {
            local_70 = 0;
            local_84 = 0;
            local_80 = INFINITY;
            do {
              lVar10 = 0;
              uVar12 = 0;
              do {
                uVar5 = local_40;
                pdVar3 = this->states;
                bVar6 = Costs::angleTest(&cost,(uint *)((ulong)local_88 * 4 +
                                                       *(long *)((long)this->lastChpt + lVar10)),
                                         &local_88,&local_8c,
                                         pdVar3 + *(uint *)(*(long *)((long)this->lastIndState +
                                                                     lVar10) + (ulong)local_88 * 4),
                                         (double *)((long)pdVar3 + lVar10),pdVar3 + local_40,
                                         &minAngle_local);
                pOVar4 = local_60;
                if (bVar6) {
                  uVar8 = (ulong)local_88;
                  local_50 = *(double *)(*(long *)((long)this->Q + lVar10) + uVar8 * 8);
                  ppdVar7 = this->S12P;
                  uVar9 = (ulong)local_8c;
                  local_58 = *ppdVar7 + uVar9;
                  dVar13 = Costs::slopeCost(&cost,(double *)((long)this->states + lVar10),
                                            this->states + uVar5,&local_88,&local_8c,
                                            *ppdVar7 + uVar8,local_58,ppdVar7[1] + uVar8,
                                            ppdVar7[1] + uVar9,ppdVar7[2] + uVar8,ppdVar7[2] + uVar9
                                           );
                  dVar13 = dVar13 + local_50 + pOVar4->penalty;
                  this = pOVar4;
                  if (dVar13 < local_80) {
                    local_84 = local_88;
                    local_80 = dVar13;
                    local_70 = uVar12;
                  }
                }
                uVar12 = (ulong)((int)uVar12 + 1);
                lVar10 = lVar10 + 8;
              } while (local_48 != lVar10);
              local_88 = local_88 + 1;
            } while (local_88 < local_8c);
          }
          this->Q[local_40][local_8c] = local_80;
          this->lastChpt[local_40][local_8c] = local_84;
          this->lastIndState[local_40][local_8c] = (uint)local_70;
          local_40 = local_40 + 1;
        } while (local_40 != local_78);
      }
      local_8c = local_8c + 1;
    } while (local_8c < (uint)local_68);
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algoSMOOTHING(std::vector< double >& data, double minAngle)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(cost.angleTest(lastChpt[u][t], t, T, states[lastIndState[u][t]], states[u], states[v], minAngle))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}